

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus_settings.cpp
# Opt level: O1

void __thiscall CMenus::RenderThemeSelection(CMenus *this,CUIRect MainView,bool Header)

{
  sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *this_00;
  CTheme *pCVar1;
  long lVar2;
  CConfig *pCVar3;
  IStorage *pIVar4;
  IGraphics *pIVar5;
  CGameClient *pCVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *format;
  CUIRect *pRect;
  long lVar10;
  CTheme *pId;
  long lVar11;
  CTheme *pCVar12;
  long in_FS_OFFSET;
  float HeaderHeight;
  CUIRect Icon;
  CListboxItem Item;
  bool IsActive;
  CUIRect MainView_local;
  char aName [128];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  MainView_local = MainView;
  if ((RenderThemeSelection(CUIRect,bool)::s_ListBox == '\0') &&
     (iVar8 = __cxa_guard_acquire(&RenderThemeSelection(CUIRect,bool)::s_ListBox), iVar8 != 0)) {
    CListBox::CListBox(&RenderThemeSelection::s_ListBox);
    __cxa_atexit(CListBox::~CListBox,&RenderThemeSelection::s_ListBox,&__dso_handle);
    __cxa_guard_release(&RenderThemeSelection(CUIRect,bool)::s_ListBox);
  }
  this_00 = &this->m_lThemes;
  if ((this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.num_elements
      == 0) {
    pCVar3 = ((this->super_CComponent).m_pClient)->m_pConfig;
    if (pCVar3->m_ClShowMenuMap == 0) {
      str_copy(pCVar3->m_ClMenuMap,"",0x40);
    }
    string_base<allocator_default<char>_>::string_base
              ((string_base<allocator_default<char>_> *)aName,"");
    aName[0x10] = '\0';
    aName[0x11] = '\0';
    aName[0x14] = -1;
    aName[0x15] = -1;
    aName[0x16] = -1;
    aName[0x17] = -1;
    sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::add(this_00,(CTheme *)aName);
    if ((void *)CONCAT44(aName._4_4_,aName._0_4_) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(aName._4_4_,aName._0_4_));
    }
    string_base<allocator_default<char>_>::string_base
              ((string_base<allocator_default<char>_> *)aName,"auto");
    aName[0x10] = '\0';
    aName[0x11] = '\0';
    aName[0x14] = -1;
    aName[0x15] = -1;
    aName[0x16] = -1;
    aName[0x17] = -1;
    sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::add(this_00,(CTheme *)aName);
    if ((void *)CONCAT44(aName._4_4_,aName._0_4_) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(aName._4_4_,aName._0_4_));
    }
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pStorage;
    (*(pIVar4->super_IInterface)._vptr_IInterface[2])(pIVar4,0xffffffff,"ui/themes",ThemeScan,this);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pStorage;
    (*(pIVar4->super_IInterface)._vptr_IInterface[2])
              (pIVar4,0xffffffff,"ui/themes",ThemeIconScan,this);
  }
  iVar8 = -1;
  if (0 < (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.
          num_elements) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      iVar7 = str_comp(*(char **)((long)&(((this->m_lThemes).
                                           super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>
                                          .list)->m_Name).str + lVar10),
                       ((this->super_CComponent).m_pClient)->m_pConfig->m_ClMenuMap);
      if (iVar7 == 0) {
        iVar8 = (int)lVar11;
        break;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x18;
    } while (lVar11 < (this->m_lThemes).
                      super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.num_elements);
  }
  if (Header) {
    pcVar9 = Localize("Theme","");
    HeaderHeight = CUI::GetListHeaderHeight(&((this->super_CComponent).m_pClient)->m_UI);
    CListBox::DoHeader(&RenderThemeSelection::s_ListBox,&MainView_local,pcVar9,HeaderHeight,2.0);
    pRect = (CUIRect *)0x0;
  }
  else {
    pRect = &MainView_local;
  }
  IsActive = this->m_ActiveListBox == 2;
  CListBox::DoStart(&RenderThemeSelection::s_ListBox,20.0,
                    (this->m_lThemes).
                    super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.num_elements,1,3
                    ,iVar8,pRect,Header,&IsActive,0xf);
  lVar10 = (long)(this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.
                 num_elements;
  if (0 < lVar10) {
    pId = (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.list;
    pCVar1 = pId + lVar10;
    pCVar12 = pId;
    do {
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                     ,0x96,1,"empty");
      CListBox::DoNextItem
                (&Item,&RenderThemeSelection::s_ListBox,pId,
                 ((long)pCVar12 -
                  (long)(this_00->super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>).
                        list >> 3) * -0x5555555555555555 - (long)iVar8 == 0,&IsActive);
      if (IsActive == true) {
        this->m_ActiveListBox = 2;
      }
      if (Item.m_Visible == true) {
        CUIRect::VSplitLeft(&Item.m_Rect,Item.m_Rect.h + Item.m_Rect.h,&Icon,&Item.m_Rect);
        if (-1 < (pId->m_IconTexture).m_Id) {
          CUIRect::VMargin(&Icon,6.0,&Icon);
          CUIRect::HMargin(&Icon,3.0,&Icon);
          pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
                    (pIVar5,(ulong)(uint)(pId->m_IconTexture).m_Id);
          (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
            [0x17])();
          (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
            [0x21])(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          aName._0_4_ = Icon.x;
          aName._4_4_ = Icon.y;
          aName._8_4_ = Icon.w;
          aName._12_4_ = Icon.h;
          pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,aName,1);
          (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
            [0x18])();
        }
        pcVar9 = (pId->m_Name).str;
        if (*pcVar9 == '\0') {
          pcVar9 = "(none)";
LAB_0016c7ba:
          str_copy(aName,pcVar9,0x80);
        }
        else {
          iVar7 = str_comp(pcVar9,"auto");
          if (iVar7 == 0) {
            pcVar9 = "(automatic)";
            goto LAB_0016c7ba;
          }
          if (pId->m_HasDay == true) {
            if ((pId->m_HasNight == true) || (pId->m_HasNight != false)) {
LAB_0016c790:
              pcVar9 = (pId->m_Name).str;
              format = "%s";
            }
            else {
              pcVar9 = (pId->m_Name).str;
              format = "%s (day)";
            }
          }
          else {
            if (pId->m_HasNight != true) goto LAB_0016c790;
            pcVar9 = (pId->m_Name).str;
            format = "%s (night)";
          }
          str_format(aName,0x80,format,pcVar9);
        }
        CUI::DoLabelSelected
                  (&((this->super_CComponent).m_pClient)->m_UI,&Item.m_Rect,aName,Item.m_Selected,
                   Item.m_Rect.h * 0.8 * 0.8,4);
      }
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                     ,0x94,(uint)(pId < pCVar1),"empty");
      pId = pId + 1;
      pCVar12 = pCVar12 + 1;
    } while (pId < pCVar1);
  }
  iVar7 = CListBox::DoEnd(&RenderThemeSelection::s_ListBox);
  if (iVar8 != iVar7) {
    this->m_ActiveListBox = 2;
    str_copy(((this->super_CComponent).m_pClient)->m_pConfig->m_ClMenuMap,
             (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.list
             [iVar7].m_Name.str,0x40);
    pCVar6 = (this->super_CComponent).m_pClient;
    pCVar6->m_pConfig->m_ClShowMenuMap =
         (uint)(*(this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.
                 list[iVar7].m_Name.str != '\0');
    CMapLayers::BackgroundMapUpdate(pCVar6->m_pMapLayersBackGround);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMenus::RenderThemeSelection(CUIRect MainView, bool Header)
{
	static CListBox s_ListBox;

	if(m_lThemes.size() == 0) // not loaded yet
	{
		if(!Config()->m_ClShowMenuMap)
			str_copy(Config()->m_ClMenuMap, "", sizeof(Config()->m_ClMenuMap)); // cl_menu_map otherwise resets to default on loading
		m_lThemes.add(CTheme("", false, false)); // no theme
		m_lThemes.add(CTheme("auto", false, false)); // auto theme
		Storage()->ListDirectory(IStorage::TYPE_ALL, "ui/themes", ThemeScan, (CMenus*)this);
		Storage()->ListDirectory(IStorage::TYPE_ALL, "ui/themes", ThemeIconScan, (CMenus*)this);
	}

	int SelectedTheme = -1;
	for(int i = 0; i < m_lThemes.size(); i++)
		if(str_comp(m_lThemes[i].m_Name, Config()->m_ClMenuMap) == 0)
		{
			SelectedTheme = i;
			break;
		}
	const int OldSelected = SelectedTheme;

	if(Header)
		s_ListBox.DoHeader(&MainView, Localize("Theme"), UI()->GetListHeaderHeight());

	bool IsActive = m_ActiveListBox == ACTLB_THEME;
	s_ListBox.DoStart(20.0f, m_lThemes.size(), 1, 3, SelectedTheme, Header?0:&MainView, Header, &IsActive);

	for(sorted_array<CTheme>::range r = m_lThemes.all(); !r.empty(); r.pop_front())
	{
		const CTheme& Theme = r.front();
		CListboxItem Item = s_ListBox.DoNextItem(&Theme, SelectedTheme == (&Theme-m_lThemes.base_ptr()), &IsActive);
		if(IsActive)
			m_ActiveListBox = ACTLB_THEME;

		if(!Item.m_Visible)
			continue;

		CUIRect Icon;
		Item.m_Rect.VSplitLeft(Item.m_Rect.h*2.0f, &Icon, &Item.m_Rect);

		// draw icon if it exists
		if(Theme.m_IconTexture.IsValid())
		{
			Icon.VMargin(6.0f, &Icon);
			Icon.HMargin(3.0f, &Icon);
			Graphics()->TextureSet(Theme.m_IconTexture);
			Graphics()->QuadsBegin();
			Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
			IGraphics::CQuadItem QuadItem(Icon.x, Icon.y, Icon.w, Icon.h);
			Graphics()->QuadsDrawTL(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}

		char aName[128];
		if(!Theme.m_Name[0])
			str_copy(aName, "(none)", sizeof(aName));
		else if(str_comp(Theme.m_Name, "auto") == 0)
			str_copy(aName, "(automatic)", sizeof(aName));
		else if(Theme.m_HasDay && Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s", Theme.m_Name.cstr());
		else if(Theme.m_HasDay && !Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s (day)", Theme.m_Name.cstr());
		else if(!Theme.m_HasDay && Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s (night)", Theme.m_Name.cstr());
		else // generic
			str_format(aName, sizeof(aName), "%s", Theme.m_Name.cstr());

		UI()->DoLabelSelected(&Item.m_Rect, aName, Item.m_Selected, Item.m_Rect.h*CUI::ms_FontmodHeight*0.8f, TEXTALIGN_ML);
	}

	SelectedTheme = s_ListBox.DoEnd();

	if(OldSelected != SelectedTheme)
	{
		m_ActiveListBox = ACTLB_THEME;
		str_copy(Config()->m_ClMenuMap, m_lThemes[SelectedTheme].m_Name, sizeof(Config()->m_ClMenuMap));
		Config()->m_ClShowMenuMap = m_lThemes[SelectedTheme].m_Name[0] ? 1 : 0;
		m_pClient->m_pMapLayersBackGround->BackgroundMapUpdate();
	}
}